

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb__arr_insertn_(void **pp,int size,int i,int n)

{
  int iVar1;
  void *pvVar2;
  void *p;
  void *local_38;
  
  pvVar2 = *pp;
  if (n != 0) {
    local_38 = pvVar2;
    if (pvVar2 == (void *)0x0) {
      stb__arr_addlen_(pp,size,n);
      return;
    }
    iVar1 = *(int *)((long)pvVar2 + -0x10);
    stb__arr_addlen_(&local_38,size,n);
    pvVar2 = local_38;
    memmove((void *)((long)((n + i) * size) + (long)local_38),
            (void *)((long)(i * size) + (long)local_38),(long)((iVar1 - i) * size));
  }
  *pp = pvVar2;
  return;
}

Assistant:

void stb__arr_insertn_(void **pp, int size, int i, int n  STB__PARAMS)
{
   void *p = *pp;
   if (n) {
      int z;

      if (p == NULL) {
         stb__arr_addlen_(pp, size, n  STB__ARGS);
         return;
      }

      z = stb_arr_len2(p);
      stb__arr_addlen_(&p, size, n  STB__ARGS);
      memmove((char *) p + (i+n)*size, (char *) p + i*size, size * (z-i));
   }
   *pp = p;
}